

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O2

Spline * createLandSpline(SplineStack *ss,float f,float g,float h,float i,float j,float k,int bl)

{
  Spline *pSVar1;
  Spline *pSVar2;
  float *pfVar3;
  int iVar4;
  int iVar5;
  Spline *pSVar6;
  Spline *pSVar7;
  Spline *pSVar8;
  Spline *pSVar9;
  Spline *pSVar10;
  Spline *pSVar11;
  Spline *pSVar12;
  Spline *pSVar13;
  int iVar14;
  float g_00;
  
  pSVar6 = createSpline_38219(ss,i * 0.9 + 0.6,bl);
  pSVar7 = createSpline_38219(ss,i * 0.39999998 + 0.6,bl);
  pSVar8 = createSpline_38219(ss,i,bl);
  g_00 = i * 0.5;
  pSVar9 = createFlatOffsetSpline(ss,f + -0.15,g_00,g_00,g_00,i * 0.6,0.5);
  pSVar10 = createFlatOffsetSpline(ss,f,i * j,g * i,g_00,i * 0.6,0.5);
  pSVar11 = createFlatOffsetSpline(ss,f,j,j,g,h,0.5);
  pSVar12 = createFlatOffsetSpline(ss,f,j,j,g,h,0.5);
  iVar14 = ss->len;
  ss->len = iVar14 + 1;
  pSVar1 = ss->stack + iVar14;
  ss->stack[iVar14].typ = 2;
  iVar4 = ss->flen;
  ((Spline *)(ss->fstack + iVar4))->len = 1;
  ss->fstack[iVar4].val = f;
  iVar5 = ss->stack[iVar14].len;
  pSVar1->val[iVar5] = (Spline *)(ss->fstack + iVar4);
  (pSVar1->loc + iVar5)[0] = -1.0;
  (pSVar1->loc + iVar5)[1] = -0.4;
  pSVar1->val[(long)iVar5 + 1] = pSVar11;
  (pSVar1->der + iVar5)[0] = 0.0;
  (pSVar1->der + iVar5)[1] = 0.0;
  ss->flen = iVar4 + 2;
  ((Spline *)(ss->fstack + (long)iVar4 + 1))->len = 1;
  ss->fstack[(long)iVar4 + 1].val = h + 0.07;
  pSVar1->loc[(long)iVar5 + 2] = 0.0;
  pSVar1->val[(long)iVar5 + 2] = (Spline *)(ss->fstack + (long)iVar4 + 1);
  pSVar1->der[(long)iVar5 + 2] = 0.0;
  ss->stack[iVar14].len = iVar5 + 3;
  pSVar13 = createFlatOffsetSpline(ss,-0.02,k,k,g,h,0.0);
  iVar14 = ss->len;
  ss->len = iVar14 + 1;
  pSVar2 = ss->stack + iVar14;
  ss->stack[iVar14].typ = 1;
  iVar14 = ss->stack[iVar14].len;
  pSVar2->val[iVar14] = pSVar6;
  pSVar2->val[(long)iVar14 + 1] = pSVar7;
  pSVar2->val[(long)iVar14 + 2] = pSVar8;
  pfVar3 = pSVar2->loc + iVar14;
  pfVar3[0] = -0.85;
  pfVar3[1] = -0.7;
  pfVar3[2] = -0.4;
  pfVar3[3] = -0.35;
  pSVar2->val[(long)iVar14 + 3] = pSVar9;
  pfVar3 = pSVar2->der + iVar14;
  pfVar3[0] = 0.0;
  pfVar3[1] = 0.0;
  pfVar3[2] = 0.0;
  pfVar3[3] = 0.0;
  pSVar2->loc[(long)iVar14 + 4] = -0.1;
  pSVar2->val[(long)iVar14 + 4] = pSVar10;
  pSVar2->der[(long)iVar14 + 4] = 0.0;
  pSVar2->loc[(long)iVar14 + 5] = 0.2;
  pSVar2->val[(long)iVar14 + 5] = pSVar11;
  pSVar2->der[(long)iVar14 + 5] = 0.0;
  if (bl == 0) {
    iVar14 = iVar14 + 6;
  }
  else {
    pSVar2->loc[(long)iVar14 + 6] = 0.4;
    pSVar2->val[(long)iVar14 + 6] = pSVar12;
    pSVar2->der[(long)iVar14 + 6] = 0.0;
    pSVar2->loc[(long)iVar14 + 7] = 0.45;
    pSVar2->val[(long)iVar14 + 7] = pSVar1;
    pSVar2->der[(long)iVar14 + 7] = 0.0;
    pSVar2->len = iVar14 + 8;
    pSVar2->loc[(long)iVar14 + 8] = 0.55;
    pSVar2->val[(long)iVar14 + 8] = pSVar1;
    pSVar2->der[(long)iVar14 + 8] = 0.0;
    pSVar2->loc[(long)iVar14 + 9] = 0.58;
    pSVar2->val[(long)iVar14 + 9] = pSVar12;
    pSVar2->der[(long)iVar14 + 9] = 0.0;
    iVar14 = iVar14 + 10;
  }
  pSVar2->loc[iVar14] = 0.7;
  pSVar2->val[iVar14] = pSVar13;
  pSVar2->der[iVar14] = 0.0;
  pSVar2->len = iVar14 + 1;
  return pSVar2;
}

Assistant:

static Spline *createLandSpline(
    SplineStack *ss, float f, float g, float h, float i, float j, float k, int bl)
{
    Spline *sp1 = createSpline_38219(ss, lerp(i, 0.6F, 1.5F), bl);
    Spline *sp2 = createSpline_38219(ss, lerp(i, 0.6F, 1.0F), bl);
    Spline *sp3 = createSpline_38219(ss, i, bl);
    const float ih = 0.5F * i;
    Spline *sp4 = createFlatOffsetSpline(ss, f-0.15F, ih, ih, ih, i*0.6F, 0.5F);
    Spline *sp5 = createFlatOffsetSpline(ss, f, j*i, g*i, ih, i*0.6F, 0.5F);
    Spline *sp6 = createFlatOffsetSpline(ss, f, j, j, g, h, 0.5F);
    Spline *sp7 = createFlatOffsetSpline(ss, f, j, j, g, h, 0.5F);

    Spline *sp8 = &ss->stack[ss->len++];
    sp8->typ = SP_RIDGES;
    addSplineVal(sp8, -1.0F, createFixSpline(ss, f), 0.0F);
    addSplineVal(sp8, -0.4F, sp6, 0.0F);
    addSplineVal(sp8,  0.0F, createFixSpline(ss, h + 0.07F), 0.0F);

    Spline *sp9 = createFlatOffsetSpline(ss, -0.02F, k, k, g, h, 0.0F);
    Spline *sp = &ss->stack[ss->len++];
    sp->typ = SP_EROSION;
    addSplineVal(sp, -0.85F, sp1, 0.0F);
    addSplineVal(sp, -0.7F,  sp2, 0.0F);
    addSplineVal(sp, -0.4F,  sp3, 0.0F);
    addSplineVal(sp, -0.35F, sp4, 0.0F);
    addSplineVal(sp, -0.1F,  sp5, 0.0F);
    addSplineVal(sp,  0.2F,  sp6, 0.0F);
    if (bl) {
        addSplineVal(sp, 0.4F,  sp7, 0.0F);
        addSplineVal(sp, 0.45F, sp8, 0.0F);
        addSplineVal(sp, 0.55F, sp8, 0.0F);
        addSplineVal(sp, 0.58F, sp7, 0.0F);
    }
    addSplineVal(sp, 0.7F, sp9, 0.0F);
    return sp;
}